

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DestroyPlatformWindow(ImGuiViewportP *viewport)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiContext *g;
  ImGuiViewportP *viewport_local;
  
  pIVar1 = GImGui;
  if ((viewport->PlatformWindowCreated & 1U) == 0) {
    bVar2 = false;
    if (((viewport->super_ImGuiViewport).RendererUserData == (void *)0x0) &&
       (bVar2 = false, (viewport->super_ImGuiViewport).PlatformUserData == (void *)0x0)) {
      bVar2 = (viewport->super_ImGuiViewport).PlatformHandle == (void *)0x0;
    }
    if (!bVar2) {
      __assert_fail("viewport->RendererUserData == __null && viewport->PlatformUserData == __null && viewport->PlatformHandle == __null"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x312e,"void ImGui::DestroyPlatformWindow(ImGuiViewportP *)");
    }
  }
  else {
    if ((GImGui->PlatformIO).Renderer_DestroyWindow != (_func_void_ImGuiViewport_ptr *)0x0) {
      (*(GImGui->PlatformIO).Renderer_DestroyWindow)(&viewport->super_ImGuiViewport);
    }
    if ((pIVar1->PlatformIO).Platform_DestroyWindow != (_func_void_ImGuiViewport_ptr *)0x0) {
      (*(pIVar1->PlatformIO).Platform_DestroyWindow)(&viewport->super_ImGuiViewport);
    }
    bVar2 = false;
    if ((viewport->super_ImGuiViewport).RendererUserData == (void *)0x0) {
      bVar2 = (viewport->super_ImGuiViewport).PlatformUserData == (void *)0x0;
    }
    if (!bVar2) {
      __assert_fail("viewport->RendererUserData == __null && viewport->PlatformUserData == __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x3125,"void ImGui::DestroyPlatformWindow(ImGuiViewportP *)");
    }
    if ((viewport->super_ImGuiViewport).ID != 0x11111111) {
      viewport->PlatformWindowCreated = false;
    }
  }
  (viewport->super_ImGuiViewport).PlatformHandle = (void *)0x0;
  (viewport->super_ImGuiViewport).PlatformUserData = (void *)0x0;
  (viewport->super_ImGuiViewport).RendererUserData = (void *)0x0;
  ImGuiViewportP::ClearRequestFlags(viewport);
  return;
}

Assistant:

void ImGui::DestroyPlatformWindow(ImGuiViewportP* viewport)
{
    ImGuiContext& g = *GImGui;
    if (viewport->PlatformWindowCreated)
    {
        if (g.PlatformIO.Renderer_DestroyWindow)
            g.PlatformIO.Renderer_DestroyWindow(viewport);
        if (g.PlatformIO.Platform_DestroyWindow)
            g.PlatformIO.Platform_DestroyWindow(viewport);
        IM_ASSERT(viewport->RendererUserData == NULL && viewport->PlatformUserData == NULL);

        // Don't clear PlatformWindowCreated for the main viewport, as we initially set that up to true in Initialize()
        // The righter way may be to leave it to the backend to set this flag all-together, and made the flag public.
        if (viewport->ID != IMGUI_VIEWPORT_DEFAULT_ID)
            viewport->PlatformWindowCreated = false;
    }
    else
    {
        IM_ASSERT(viewport->RendererUserData == NULL && viewport->PlatformUserData == NULL && viewport->PlatformHandle == NULL);
    }
    viewport->RendererUserData = viewport->PlatformUserData = viewport->PlatformHandle = NULL;
    viewport->ClearRequestFlags();
}